

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O3

void ExchCXX::detail::host_eval_exc_vxc_helper_polar<ExchCXX::BuiltinSCAN_X>
               (int N,const_host_buffer_type rho,const_host_buffer_type sigma,
               const_host_buffer_type lapl,const_host_buffer_type tau,host_buffer_type eps,
               host_buffer_type vrho,host_buffer_type vsigma,host_buffer_type vlapl,
               host_buffer_type vtau)

{
  double dVar1;
  double dVar2;
  double *vsigma_i;
  long lVar3;
  const_host_buffer_type pdVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  undefined1 auVar10 [16];
  double vlb;
  double vla;
  double local_40;
  double local_38;
  
  if (0 < N) {
    pdVar4 = sigma + 2;
    lVar3 = 0;
    do {
      dVar1 = pdVar4[-2];
      dVar2 = pdVar4[-1];
      dVar9 = *pdVar4;
      auVar6 = *(undefined1 (*) [16])((long)rho + lVar3);
      auVar7 = *(undefined1 (*) [16])((long)tau + lVar3);
      *eps = 0.0;
      *(undefined8 *)((long)vrho + lVar3) = 0;
      ((undefined8 *)((long)vrho + lVar3))[1] = 0;
      vsigma[2] = 0.0;
      *vsigma = 0.0;
      vsigma[1] = 0.0;
      local_38 = 0.0;
      local_40 = 0.0;
      *(undefined8 *)((long)vtau + lVar3) = 0;
      ((undefined8 *)((long)vtau + lVar3))[1] = 0;
      if (1e-15 < auVar6._8_8_ + auVar6._0_8_) {
        auVar8._8_8_ = dVar9;
        auVar8._0_8_ = dVar1;
        auVar8 = maxpd(_DAT_0101f610,auVar8);
        auVar6 = maxpd(_DAT_0101f3b0,auVar6);
        auVar10 = maxpd(_DAT_0101f620,auVar7);
        auVar7._0_8_ = auVar6._0_8_ * 8.0 * auVar10._0_8_;
        auVar7._8_8_ = auVar6._8_8_ * 8.0 * auVar10._8_8_;
        auVar7 = minpd(auVar7,auVar8);
        dVar9 = (auVar7._8_8_ + auVar7._0_8_) * 0.5;
        uVar5 = -(ulong)(-dVar9 <= dVar2);
        dVar1 = (double)(uVar5 & (ulong)dVar2 | ~uVar5 & (ulong)-dVar9);
        uVar5 = -(ulong)(dVar1 <= dVar9);
        kernel_traits<ExchCXX::BuiltinSCAN_X>::eval_exc_vxc_polar_impl
                  (auVar6._0_8_,auVar6._8_8_,auVar7._0_8_,
                   (double)(~uVar5 & (ulong)dVar9 | uVar5 & (ulong)dVar1),auVar7._8_8_,0.0,0.0,
                   auVar10._0_8_,auVar10._8_8_,eps,(double *)((long)vrho + lVar3),
                   (double *)((long)vrho + lVar3 + 8),vsigma,vsigma + 1,vsigma + 2,&local_38,
                   &local_40,(double *)(lVar3 + (long)vtau),(double *)((long)vtau + lVar3 + 8));
      }
      vsigma = vsigma + 3;
      pdVar4 = pdVar4 + 3;
      lVar3 = lVar3 + 0x10;
      eps = eps + 1;
    } while ((ulong)(uint)N << 4 != lVar3);
  }
  return;
}

Assistant:

MGGA_EXC_VXC_GENERATOR( host_eval_exc_vxc_helper_polar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    auto* rho_i    = rho   + 2*i;
    auto* sigma_i  = sigma + 3*i;
    auto* tau_i    = tau   + 2*i;
    auto* lapl_i   = lapl  + 2*i;
    auto* vrho_i   = vrho   + 2*i;
    auto* vsigma_i = vsigma + 3*i;
    auto* vtau_i   = vtau   + 2*i;
    auto* vlapl_i  = vlapl  + 2*i;


    const double lapl_a_use = traits::needs_laplacian ? lapl_i[0] : 0.0;
    const double lapl_b_use = traits::needs_laplacian ? lapl_i[1] : 0.0;
    double vla, vlb;
    traits::eval_exc_vxc_polar( rho_i[0], rho_i[1], sigma_i[0], 
      sigma_i[1], sigma_i[2], lapl_a_use, lapl_b_use, tau_i[0], tau_i[1], 
      eps[i], vrho_i[0], vrho_i[1],
      vsigma_i[0], vsigma_i[1], vsigma_i[2], vla, vlb,
      vtau_i[0], vtau_i[1] );
    if(traits::needs_laplacian) {
      vlapl_i[0] = vla;
      vlapl_i[1] = vlb;
    }

  }

}